

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcEquipmentStandard::~IfcEquipmentStandard(IfcEquipmentStandard *this)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  
  *(undefined8 *)&(this->super_IfcControl).super_IfcObject = 0x854868;
  *(undefined8 *)&(this->super_IfcControl).field_0xf0 = 0x8548e0;
  *(undefined8 *)&(this->super_IfcControl).super_IfcObject.field_0x88 = 0x854890;
  (this->super_IfcControl).super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x8548b8;
  puVar2 = *(undefined1 **)
            &(this->super_IfcControl).super_IfcObject.
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.field_0x10;
  puVar1 = &(this->super_IfcControl).super_IfcObject.
            super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.field_0x20;
  if (puVar2 != puVar1) {
    operator_delete(puVar2,*(long *)puVar1 + 1);
  }
  *(undefined8 *)&(this->super_IfcControl).super_IfcObject = 0x854980;
  *(undefined8 *)&(this->super_IfcControl).field_0xf0 = 0x8549a8;
  puVar2 = *(undefined1 **)&(this->super_IfcControl).super_IfcObject.field_0x60;
  puVar1 = &(this->super_IfcControl).super_IfcObject.field_0x70;
  if (puVar2 != puVar1) {
    operator_delete(puVar2,*(long *)puVar1 + 1);
  }
  puVar2 = *(undefined1 **)&(this->super_IfcControl).super_IfcObject.field_0x38;
  puVar1 = &(this->super_IfcControl).super_IfcObject.field_0x48;
  if (puVar2 != puVar1) {
    operator_delete(puVar2,*(long *)puVar1 + 1);
  }
  puVar2 = *(undefined1 **)&(this->super_IfcControl).super_IfcObject.field_0x10;
  puVar1 = &(this->super_IfcControl).super_IfcObject.field_0x20;
  if (puVar2 != puVar1) {
    operator_delete(puVar2,*(long *)puVar1 + 1);
  }
  operator_delete(this,0x108);
  return;
}

Assistant:

IfcEquipmentStandard() : Object("IfcEquipmentStandard") {}